

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_cleanup(demo *demo)

{
  bool bVar1;
  uint local_14;
  uint32_t i;
  demo *demo_local;
  
  for (local_14 = 0; local_14 < demo->swapchainImageCount; local_14 = local_14 + 1) {
    (*glad_vkDestroyFramebuffer)
              (demo->device,demo->framebuffers[local_14],(VkAllocationCallbacks *)0x0);
  }
  free(demo->framebuffers);
  (*glad_vkDestroyDescriptorPool)(demo->device,demo->desc_pool,(VkAllocationCallbacks *)0x0);
  if (demo->setup_cmd != (VkCommandBuffer)0x0) {
    (*glad_vkFreeCommandBuffers)(demo->device,demo->cmd_pool,1,&demo->setup_cmd);
  }
  (*glad_vkFreeCommandBuffers)(demo->device,demo->cmd_pool,1,&demo->draw_cmd);
  (*glad_vkDestroyCommandPool)(demo->device,demo->cmd_pool,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyPipeline)(demo->device,demo->pipeline,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyRenderPass)(demo->device,demo->render_pass,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyPipelineLayout)(demo->device,demo->pipeline_layout,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyDescriptorSetLayout)(demo->device,demo->desc_layout,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyBuffer)(demo->device,(demo->vertices).buf,(VkAllocationCallbacks *)0x0);
  (*glad_vkFreeMemory)(demo->device,(demo->vertices).mem,(VkAllocationCallbacks *)0x0);
  bVar1 = false;
  while (!bVar1) {
    (*glad_vkDestroyImageView)(demo->device,demo->textures[0].view,(VkAllocationCallbacks *)0x0);
    (*glad_vkDestroyImage)(demo->device,demo->textures[0].image,(VkAllocationCallbacks *)0x0);
    (*glad_vkFreeMemory)(demo->device,demo->textures[0].mem,(VkAllocationCallbacks *)0x0);
    (*glad_vkDestroySampler)(demo->device,demo->textures[0].sampler,(VkAllocationCallbacks *)0x0);
    bVar1 = true;
  }
  for (local_14 = 0; local_14 < demo->swapchainImageCount; local_14 = local_14 + 1) {
    (*glad_vkDestroyImageView)
              (demo->device,demo->buffers[local_14].view,(VkAllocationCallbacks *)0x0);
  }
  (*glad_vkDestroyImageView)(demo->device,(demo->depth).view,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyImage)(demo->device,(demo->depth).image,(VkAllocationCallbacks *)0x0);
  (*glad_vkFreeMemory)(demo->device,(demo->depth).mem,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroySwapchainKHR)(demo->device,demo->swapchain,(VkAllocationCallbacks *)0x0);
  free(demo->buffers);
  (*glad_vkDestroyDevice)(demo->device,(VkAllocationCallbacks *)0x0);
  if ((demo->validate & 1U) != 0) {
    (*glad_vkDestroyDebugReportCallbackEXT)
              (demo->inst,demo->msg_callback,(VkAllocationCallbacks *)0x0);
  }
  (*glad_vkDestroySurfaceKHR)(demo->inst,demo->surface,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroyInstance)(demo->inst,(VkAllocationCallbacks *)0x0);
  free(demo->queue_props);
  glfwDestroyWindow(demo->window);
  glfwTerminate();
  return;
}

Assistant:

static void demo_cleanup(struct demo *demo) {
    uint32_t i;

    for (i = 0; i < demo->swapchainImageCount; i++) {
        vkDestroyFramebuffer(demo->device, demo->framebuffers[i], NULL);
    }
    free(demo->framebuffers);
    vkDestroyDescriptorPool(demo->device, demo->desc_pool, NULL);

    if (demo->setup_cmd) {
        vkFreeCommandBuffers(demo->device, demo->cmd_pool, 1, &demo->setup_cmd);
    }
    vkFreeCommandBuffers(demo->device, demo->cmd_pool, 1, &demo->draw_cmd);
    vkDestroyCommandPool(demo->device, demo->cmd_pool, NULL);

    vkDestroyPipeline(demo->device, demo->pipeline, NULL);
    vkDestroyRenderPass(demo->device, demo->render_pass, NULL);
    vkDestroyPipelineLayout(demo->device, demo->pipeline_layout, NULL);
    vkDestroyDescriptorSetLayout(demo->device, demo->desc_layout, NULL);

    vkDestroyBuffer(demo->device, demo->vertices.buf, NULL);
    vkFreeMemory(demo->device, demo->vertices.mem, NULL);

    for (i = 0; i < DEMO_TEXTURE_COUNT; i++) {
        vkDestroyImageView(demo->device, demo->textures[i].view, NULL);
        vkDestroyImage(demo->device, demo->textures[i].image, NULL);
        vkFreeMemory(demo->device, demo->textures[i].mem, NULL);
        vkDestroySampler(demo->device, demo->textures[i].sampler, NULL);
    }

    for (i = 0; i < demo->swapchainImageCount; i++) {
        vkDestroyImageView(demo->device, demo->buffers[i].view, NULL);
    }

    vkDestroyImageView(demo->device, demo->depth.view, NULL);
    vkDestroyImage(demo->device, demo->depth.image, NULL);
    vkFreeMemory(demo->device, demo->depth.mem, NULL);

    vkDestroySwapchainKHR(demo->device, demo->swapchain, NULL);
    free(demo->buffers);

    vkDestroyDevice(demo->device, NULL);
    if (demo->validate) {
        vkDestroyDebugReportCallbackEXT(demo->inst, demo->msg_callback, NULL);
    }
    vkDestroySurfaceKHR(demo->inst, demo->surface, NULL);
    vkDestroyInstance(demo->inst, NULL);

    free(demo->queue_props);

    glfwDestroyWindow(demo->window);
    glfwTerminate();
}